

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void * __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableRawRepeatedField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,CppType cpptype,
          int ctype,Descriptor *desc)

{
  LogMessage *pLVar1;
  void *pvVar2;
  LogFinisher local_d9;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (*(int *)(field + 0x30) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"\"MutableRawRepeatedField\"",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) !=
      cpptype) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableRawRepeatedField",cpptype);
  }
  if ((-1 < ctype) && (*(int *)(*(long *)(field + 0x60) + 0x40) != ctype)) {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
               ,0x455);
    pLVar1 = LogMessage::operator<<
                       (&local_a0,"CHECK failed: (field->options().ctype()) == (ctype): ");
    pLVar1 = LogMessage::operator<<(pLVar1,"subtype mismatch");
    LogFinisher::operator=((LogFinisher *)&local_d8,pLVar1);
    LogMessage::~LogMessage(&local_a0);
  }
  if ((desc != (Descriptor *)0x0) && (*(Descriptor **)(field + 0x48) != desc)) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
               ,0x457);
    pLVar1 = LogMessage::operator<<(&local_68,"CHECK failed: (field->message_type()) == (desc): ");
    pLVar1 = LogMessage::operator<<(pLVar1,"wrong submessage type");
    LogFinisher::operator=((LogFinisher *)&local_d8,pLVar1);
    LogMessage::~LogMessage(&local_68);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    if (this->extensions_offset_ == -1) {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4b5);
      pLVar1 = LogMessage::operator<<(&local_d8,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_d9,pLVar1);
      LogMessage::~LogMessage(&local_d8);
    }
    pvVar2 = ExtensionSet::MutableRawRepeatedField
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite +
                        (long)this->extensions_offset_),*(int *)(field + 0x28));
  }
  else {
    pvVar2 = (void *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                     (long)this->offsets_
                           [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30))
                                 >> 3) * -0x11111111]);
  }
  return pvVar2;
}

Assistant:

void* GeneratedMessageReflection::MutableRawRepeatedField(
    Message* message, const FieldDescriptor* field,
    FieldDescriptor::CppType cpptype,
    int ctype, const Descriptor* desc) const {
  USAGE_CHECK_REPEATED("MutableRawRepeatedField");
  if (field->cpp_type() != cpptype)
    ReportReflectionUsageTypeError(descriptor_,
        field, "MutableRawRepeatedField", cpptype);
  if (ctype >= 0)
    GOOGLE_CHECK_EQ(field->options().ctype(), ctype) << "subtype mismatch";
  if (desc != NULL)
    GOOGLE_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension())
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number());
  else
    return reinterpret_cast<uint8*>(message) + offsets_[field->index()];
}